

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O1

void __thiscall MTRand::load(MTRand *this,uint32 *loadArray)

{
  uint32 uVar1;
  long lVar2;
  uint32 *la;
  uint32 *s;
  
  lVar2 = 0;
  do {
    this->state[lVar2] = loadArray[lVar2];
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 0x270);
  uVar1 = loadArray[lVar2];
  this->left = (int)uVar1;
  this->pNext = (uint32 *)((long)this->state + ((long)(0x27000000000 - (uVar1 << 0x20)) >> 0x1d));
  return;
}

Assistant:

void MTRand::load(uint32 *const loadArray) {
  uint32 *s = state;
  uint32 *la = loadArray;
  int i = N;
  for (; i--; *s++ = *la++) {
  }
  left = *la;
  pNext = &state[N - left];
}